

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O3

vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
* __thiscall
HawkTracer::client::CallGraph::make
          (vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
           *__return_storage_ptr__,CallGraph *this,
          vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
          *events)

{
  pointer pNVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  __normal_iterator<HawkTracer::client::CallGraph::NodeData_*,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>
  __i;
  pointer pNVar5;
  NodeData *event;
  pointer pNVar6;
  
  pNVar6 = (events->
           super__Vector_base<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (events->
           super__Vector_base<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar6 != pNVar1) {
    uVar4 = ((long)pNVar1 - (long)pNVar6 >> 4) * -0x5555555555555555;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<HawkTracer::client::CallGraph::NodeData*,std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<HawkTracer::client::CallGraph::make(std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>&)::__0>>
              (pNVar6,pNVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pNVar1 - (long)pNVar6 < 0x301) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<HawkTracer::client::CallGraph::NodeData*,std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>>,__gnu_cxx::__ops::_Iter_comp_iter<HawkTracer::client::CallGraph::make(std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>&)::__0>>
                (pNVar6,pNVar1);
    }
    else {
      pNVar5 = pNVar6 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<HawkTracer::client::CallGraph::NodeData*,std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>>,__gnu_cxx::__ops::_Iter_comp_iter<HawkTracer::client::CallGraph::make(std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>&)::__0>>
                (pNVar6,pNVar5);
      for (; pNVar5 != pNVar1; pNVar5 = pNVar5 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<HawkTracer::client::CallGraph::NodeData*,std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>>,__gnu_cxx::__ops::_Val_comp_iter<HawkTracer::client::CallGraph::make(std::vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>&)::__0>>
                  (pNVar5);
      }
    }
  }
  pNVar1 = (events->
           super__Vector_base<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar6 = (events->
                super__Vector_base<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
                )._M_impl.super__Vector_impl_data._M_start; pNVar6 != pNVar1; pNVar6 = pNVar6 + 1) {
    bVar3 = _try_add_event_to_existing_calltree(this,pNVar6);
    if (!bVar3) {
      _add_new_calltree(this,pNVar6);
    }
  }
  std::
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  ::vector(__return_storage_ptr__,&this->_root_calls);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::shared_ptr<CallGraph::TreeNode>, int>> 
    CallGraph::make(std::vector<NodeData>& events)
{
    std::sort(events.begin(), events.end(), 
            [](const NodeData& e1, const NodeData& e2){
                return e1.start_ts < e2.start_ts;
            });
    for (const auto& event : events)
    {
        _add_event(event);
    }

    return _root_calls;
}